

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbmradix.c
# Opt level: O0

void rsorta(string *a,int n,int b)

{
  int iVar1;
  string *a_00;
  undefined8 uVar2;
  undefined8 uVar3;
  string puVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  string *ppuVar8;
  int local_4878;
  int local_4874;
  int cmax;
  int c;
  int *cp;
  string t;
  string r;
  string *an;
  string *ak;
  string *pile [256];
  undefined8 *local_4040;
  mbmstack_t *bigsp;
  mbmstack_t *oldsp;
  mbmstack_t stmp;
  mbmstack_t *sp;
  mbmstack_t stack [1024];
  int b_local;
  int n_local;
  string *a_local;
  
  sp = (mbmstack_t *)a;
  stack[0].sa._0_4_ = n;
  stack[0].sa._4_4_ = b;
  stmp._8_8_ = &stack[0].sn;
  do {
    while( true ) {
      while( true ) {
        uVar5 = stmp._8_8_;
        if ((ulong)stmp._8_8_ <= &sp) {
          return;
        }
        puVar7 = (undefined8 *)(stmp._8_8_ + -0x10);
        a_00 = *(string **)(stmp._8_8_ + -0x10);
        stack[0x3ff].si = *(int *)(stmp._8_8_ + -8);
        stack[0x3ff].sn = *(int *)(stmp._8_8_ + -4);
        stmp._8_8_ = puVar7;
        if (9 < stack[0x3ff].si) break;
        simplesort(a_00,stack[0x3ff].si,stack[0x3ff].sn);
      }
      if (rsorta::nc == 0) break;
LAB_00314d90:
      local_4874 = 2;
      local_4878 = 0;
      an = a_00 + rsorta::count[0];
      _cmax = rsorta::count + rsorta::cmin;
      local_4040 = puVar7;
      for (; 0 < rsorta::nc; rsorta::nc = rsorta::nc + -1) {
        for (; *_cmax == 0; _cmax = _cmax + 1) {
        }
        if (1 < *_cmax) {
          if (local_4874 < *_cmax) {
            local_4874 = *_cmax;
            local_4040 = (undefined8 *)stmp._8_8_;
          }
          *(string **)stmp._8_8_ = an;
          *(int *)(stmp._8_8_ + 8) = *_cmax;
          *(int *)(stmp._8_8_ + 0xc) = stack[0x3ff].sn + 1;
          stmp._8_8_ = stmp._8_8_ + 0x10;
        }
        an = an + *_cmax;
        local_4878 = (int)((long)(_cmax + -0x34e19c) >> 2);
        pile[(long)local_4878 + -1] = an;
        _cmax = _cmax + 1;
      }
      uVar2 = *puVar7;
      uVar3 = *(undefined8 *)(uVar5 + -8);
      *puVar7 = *local_4040;
      *(undefined8 *)(uVar5 + -8) = local_4040[1];
      *local_4040 = uVar2;
      local_4040[1] = uVar3;
      iVar1 = rsorta::count[local_4878];
      rsorta::count[local_4878] = 0;
      an = a_00;
      while (an < a_00 + stack[0x3ff].si + -(long)iVar1) {
        t = *an;
        while( true ) {
          uVar6 = (uint)t[stack[0x3ff].sn];
          ppuVar8 = pile[(long)(int)uVar6 + -1];
          pile[(long)(int)uVar6 + -1] = ppuVar8 + -1;
          if (ppuVar8 + -1 <= an) break;
          puVar4 = *pile[(long)(int)uVar6 + -1];
          *pile[(long)(int)uVar6 + -1] = t;
          t = puVar4;
        }
        *an = t;
        an = an + rsorta::count[(int)uVar6];
        rsorta::count[(int)uVar6] = 0;
      }
    }
    rsorta::cmin = 0xff;
    an = a_00;
    while (an < a_00 + stack[0x3ff].si) {
      ppuVar8 = an + 1;
      uVar6 = (uint)(*an)[stack[0x3ff].sn];
      iVar1 = rsorta::count[(int)uVar6];
      rsorta::count[(int)uVar6] = iVar1 + 1;
      an = ppuVar8;
      if ((iVar1 + 1 == 1) && (uVar6 != 0)) {
        if ((int)uVar6 < rsorta::cmin) {
          rsorta::cmin = uVar6;
        }
        rsorta::nc = rsorta::nc + 1;
      }
    }
    if (puVar7 + (long)rsorta::nc * 2 <= &stack[0x3ff].sn) goto LAB_00314d90;
    rsorta(a_00,stack[0x3ff].si,stack[0x3ff].sn);
  } while( true );
}

Assistant:

static void rsorta(string *a, int n, int b)
{
#define push(a, n, i)   sp->sa = a, sp->sn = n, (sp++)->si = i
#define pop(a, n, i)    a = (--sp)->sa, n = sp->sn, i = sp->si
#define stackempty()    (sp <= stack)
#define swap(p, q, r)   r = p, p = q, q = r
        mbmstack_t      stack[SIZE], *sp = stack, stmp, *oldsp, *bigsp;
        string          *pile[256], *ak, *an, r, t;
        static int      count[256], cmin, nc;
        int             *cp, c, cmax;

        push(a, n, b);

        while(!stackempty()) {
                pop(a, n, b);
                if(n < THRESHOLD) {
                        simplesort(a, n, b);
                        continue;
                }
                an = a + n;
                if(nc == 0) {                       /* untallied? */
                        cmin = 255;                 /* tally */
                        for(ak = a; ak < an; ) {
                                c = (*ak++)[b];
                                if(++count[c] == 1 && c > 0) {
                                        if(c < cmin) cmin = c;
                                        nc++;
                                }
                        }
                        if(sp+nc > stack+SIZE) {     /* stack overflow */
                                  rsorta(a, n, b);
                                  continue;
                        }
                }
                oldsp = bigsp = sp, c = 2;         /* logartihmic stack */
                pile[0] = ak = a+count[cmax=0];    /* find places */
                for(cp = count+cmin; nc > 0; cp++, nc--) {
                         while(*cp == 0) cp++;
                         if (*cp > 1) {
                                  if(*cp > c) c = *cp, bigsp = sp;
                                  push(ak, *cp, b+1);
                         }
                         pile[cmax = cp-count] = ak += *cp;
                }
                swap(*oldsp, *bigsp, stmp);
                an -= count[cmax];                 /* permute home */
                count[cmax] = 0;
                for(ak = a; ak < an; ak += count[c], count[c] = 0) {
                        r = *ak;
                        while(--pile[c = r[b]] > ak)
                                swap(*pile[c], r, t);
                        *ak = r;
                                /* here nc = count[...] = 0 */
                }
        }
}